

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O1

BigInt * __thiscall BigInt::operator*(BigInt *__return_storage_ptr__,BigInt *this,BigInt *v)

{
  iterator __position;
  pointer plVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  vll b;
  vll a;
  vll c;
  vector<long_long,_std::allocator<long_long>_> b6;
  vector<long_long,_std::allocator<long_long>_> a6;
  vector<long_long,_std::allocator<long_long>_> local_e0;
  vector<long_long,_std::allocator<long_long>_> local_c8;
  vll local_b0;
  vector<long_long,_std::allocator<long_long>_> local_98;
  vector<long_long,_std::allocator<long_long>_> local_78;
  vector<long_long,_std::allocator<long_long>_> local_60;
  BigInt local_48;
  
  convert_base(&local_60,&this->vector_value,base_digits,6);
  convert_base(&local_78,&v->vector_value,base_digits,6);
  std::vector<long_long,std::allocator<long_long>>::
  vector<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,void>
            ((vector<long_long,std::allocator<long_long>> *)&local_c8,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_60.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_60.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_e0);
  std::vector<long_long,std::allocator<long_long>>::
  vector<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,void>
            ((vector<long_long,std::allocator<long_long>> *)&local_e0,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_78.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_78.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_b0);
  if ((ulong)((long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start) <
      (ulong)((long)local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start)) {
    do {
      local_b0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(longlong *)&local_b0);
      }
      else {
        *local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_finish = 0;
        local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    } while ((ulong)((long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_start) <
             (ulong)((long)local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_start));
  }
  if ((ulong)((long)local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start) <
      (ulong)((long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start)) {
    do {
      local_b0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (&local_e0,
                   (iterator)
                   local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(longlong *)&local_b0);
      }
      else {
        *local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_finish = 0;
        local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    } while ((ulong)((long)local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_start) <
             (ulong)((long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_start));
  }
  while (uVar2 = (long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3, (uVar2 & uVar2 - 1) != 0) {
    local_b0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                (&local_c8,
                 (iterator)
                 local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longlong *)&local_b0);
    }
    else {
      *local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                (&local_e0,
                 (iterator)
                 local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longlong *)&local_98);
    }
    else {
      *local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  karatsubaMultiply(&local_b0,&local_c8,&local_e0);
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->sign = 1;
  __return_storage_ptr__->sign = v->sign * this->sign;
  if (0 < (int)((ulong)((long)local_b0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar3 = (long)(int)lVar5 +
              local_b0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      lVar5 = lVar3 / 1000000;
      local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(lVar3 % 1000000);
      __position._M_current =
           (__return_storage_ptr__->vector_value).
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->vector_value).
          super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (&__return_storage_ptr__->vector_value,__position,(longlong *)&local_98);
      }
      else {
        *__position._M_current =
             (longlong)
             local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->vector_value).
        super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)((ulong)((long)local_b0.
                                         super__Vector_base<long_long,_std::allocator<long_long>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_b0.
                                        super__Vector_base<long_long,_std::allocator<long_long>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  convert_base(&local_98,&__return_storage_ptr__->vector_value,6,base_digits);
  plVar1 = (__return_storage_ptr__->vector_value).
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1);
  }
  if (local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  trim(&local_48,__return_storage_ptr__);
  if (local_48.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (longlong *)0x0) {
    operator_delete(local_78.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (longlong *)0x0) {
    operator_delete(local_60.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator*(const BigInt &v) const { //! multiplication operator overloading
        /* //! works with deque
         BigInt result;
         BigInt This = *this;
         for (long long &vectorValue : that.vector_value) {
             result += This * vectorValue;
             This.vector_value.push_front(0); //! shift the least significant
         }

         return result;*/
        //! log on the value space 24 ms :(
        /* //! log mul
          if (that == __ONE__)
              return (*this);

          BigInt result;
          pair<BigInt, int> halfDiv = that.Half();
          result = (*this) * halfDiv.first;
          result = result.Double();
          //result += result;
          if (halfDiv.second)
              result = result + (*this);
          return result;*/


        vector<long long> a6 = convert_base(this->vector_value, base_digits, 6);
        vector<long long> b6 = convert_base(v.vector_value, base_digits, 6);
        vll a(a6.begin(), a6.end());
        vll b(b6.begin(), b6.end());
        while (a.size() < b.size())
            a.push_back(0);
        while (b.size() < a.size())
            b.push_back(0);
        while (a.size() & (a.size() - 1))
            a.push_back(0), b.push_back(0);
        vll c = karatsubaMultiply(a, b);
        BigInt res;
        res.sign = sign * v.sign;
        for (int i = 0, carry = 0; i < (int) c.size(); i++) {
            long long cur = c[i] + carry;
            res.vector_value.push_back((int) (cur % 1000000));
            carry = (int) (cur / 1000000);
        }
        res.vector_value = convert_base(res.vector_value, 6, base_digits);
        res.trim();
        return res;
    }